

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::ThreadPool::ThreadPool(ThreadPool *this,size_t n)

{
  worker local_38;
  
  (this->super_TaskQueue)._vptr_TaskQueue = (_func_int **)&PTR__ThreadPool_001bf4c0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->jobs_).super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->jobs_;
  (this->jobs_).super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->jobs_;
  (this->jobs_).super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl._M_node._M_size = 0;
  this->shutdown_ = false;
  std::condition_variable::condition_variable(&this->cond_);
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  if (n != 0) {
    do {
      local_38.pool_ = this;
      std::vector<std::thread,_std::allocator<std::thread>_>::
      emplace_back<httplib::ThreadPool::worker>(&this->threads_,&local_38);
      n = n - 1;
    } while (n != 0);
  }
  return;
}

Assistant:

explicit ThreadPool(size_t n) : shutdown_(false) {
    while (n) {
      threads_.emplace_back(worker(*this));
      n--;
    }
  }